

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O0

bool __thiscall
sector_t::MoveAttached(sector_t *this,int crush,double move,int floorOrCeiling,bool resetfailed)

{
  bool bVar1;
  bool resetfailed_local;
  int floorOrCeiling_local;
  double move_local;
  int crush_local;
  sector_t_conflict *this_local;
  
  bVar1 = P_Scroll3dMidtex((sector_t_conflict *)this,crush,move,floorOrCeiling != 0);
  if ((bVar1) || (!resetfailed)) {
    bVar1 = P_MoveLinkedSectors((sector_t_conflict *)this,crush,move,floorOrCeiling != 0);
    if ((bVar1) || (!resetfailed)) {
      this_local._7_1_ = true;
    }
    else {
      P_MoveLinkedSectors((sector_t_conflict *)this,crush,-move,floorOrCeiling != 0);
      P_Scroll3dMidtex((sector_t_conflict *)this,crush,-move,floorOrCeiling != 0);
      this_local._7_1_ = false;
    }
  }
  else {
    P_Scroll3dMidtex((sector_t_conflict *)this,crush,-move,floorOrCeiling != 0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool sector_t::MoveAttached(int crush, double move, int floorOrCeiling, bool resetfailed)
{
	if (!P_Scroll3dMidtex(this, crush, move, !!floorOrCeiling) && resetfailed)
	{
		P_Scroll3dMidtex(this, crush, -move, !!floorOrCeiling);
		return false;
	}
	if (!P_MoveLinkedSectors(this, crush, move, !!floorOrCeiling) && resetfailed)
	{
		P_MoveLinkedSectors(this, crush, -move, !!floorOrCeiling);
		P_Scroll3dMidtex(this, crush, -move, !!floorOrCeiling);
		return false;
	}
	return true;
}